

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcOrientedEdge::IfcOrientedEdge(IfcOrientedEdge *this)

{
  *(undefined ***)&this->field_0x78 = &PTR__Object_0073a1d0;
  *(undefined8 *)&this->field_0x80 = 0;
  *(char **)&this->field_0x88 = "IfcOrientedEdge";
  IfcEdge::IfcEdge(&this->super_IfcEdge,&PTR_construction_vtable_24__00754c60);
  *(undefined8 *)&(this->super_IfcEdge).field_0x48 = 0;
  *(undefined8 *)&(this->super_IfcEdge).field_0x50 = 0;
  (this->super_IfcEdge).super_IfcTopologicalRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0x754ba8;
  *(undefined8 *)&this->field_0x78 = 0x754c48;
  *(undefined8 *)
   &(this->super_IfcEdge).super_IfcTopologicalRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0x754bd0;
  *(undefined8 *)
   &(this->super_IfcEdge).super_IfcTopologicalRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0x754bf8;
  *(undefined8 *)&(this->super_IfcEdge).field_0x40 = 0x754c20;
  (this->Orientation)._M_dataplus._M_p = (pointer)&(this->Orientation).field_2;
  (this->Orientation)._M_string_length = 0;
  (this->Orientation).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

IfcOrientedEdge() : Object("IfcOrientedEdge") {}